

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O3

void __thiscall helics::Federate::requestTimeAsync(Federate *this,Time nextInternalTimeStep)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Result<TimeRepresentation<count_time<9,_long>_>_> *this_00;
  InvalidFunctionCall *this_01;
  char *pcVar4;
  size_t sVar5;
  _State_baseV2 *__tmp;
  bool bVar6;
  string_view message;
  shared_ptr<std::__future_base::_State_baseV2> __state;
  handle asyncInfo;
  long *local_80;
  __basic_future<TimeRepresentation<count_time<9,_long>_>_> local_78;
  __state_type local_68;
  _func_int **local_58 [2];
  shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *local_48;
  unique_lock<std::mutex> local_40;
  
  if (this->singleThreadFederate == true) {
    this_01 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
    pcVar4 = "Async function calls and methods are not allowed for single thread federates";
    sVar5 = 0x4c;
  }
  else {
    LOCK();
    bVar6 = (this->currentMode)._M_i == EXECUTING;
    if (bVar6) {
      (this->currentMode)._M_i = PENDING_TIME;
    }
    UNLOCK();
    if (bVar6) {
      if ((this->timeRequestEntryCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
        std::
        function<void_(TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_bool)>
        ::operator()(&this->timeRequestEntryCallback,
                     (TimeRepresentation<count_time<9,_long>_>)(this->mCurrentTime).internalTimeCode
                     ,(TimeRepresentation<count_time<9,_long>_>)
                      nextInternalTimeStep.internalTimeCode,false);
      }
      local_48 = (this->asyncCallInfo)._M_t.
                 super___uniq_ptr_impl<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
                 .
                 super__Head_base<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_false>
                 ._M_head_impl;
      local_40._M_device = &local_48->m_mutex;
      local_40._M_owns = false;
      std::unique_lock<std::mutex>::lock(&local_40);
      local_40._M_owns = true;
      local_68.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_68.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
      p_Var3->_M_use_count = 1;
      p_Var3->_M_weak_count = 1;
      p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0054abc0;
      p_Var3[1]._M_use_count = 0;
      p_Var3[1]._M_weak_count = 0;
      *(undefined4 *)&p_Var3[2]._vptr__Sp_counted_base = 0;
      *(undefined1 *)((long)&p_Var3[2]._vptr__Sp_counted_base + 4) = 0;
      p_Var3[2]._M_use_count = 0;
      p_Var3[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var3[3]._M_use_count = 0;
      p_Var3[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_0054ac10;
      this_00 = (_Result<TimeRepresentation<count_time<9,_long>_>_> *)operator_new(0x20);
      std::__future_base::_Result<TimeRepresentation<count_time<9,_long>_>_>::_Result(this_00);
      p_Var3[4]._vptr__Sp_counted_base = (_func_int **)this_00;
      *(Federate **)&p_Var3[4]._M_use_count = this;
      p_Var3[5]._vptr__Sp_counted_base = (_func_int **)nextInternalTimeStep.internalTimeCode;
      local_58[0] = (_func_int **)0x0;
      local_80 = (long *)operator_new(0x20);
      *local_80 = (long)&PTR___State_0054ac68;
      local_80[1] = (long)(p_Var3 + 1);
      local_80[2] = (long)std::__future_base::
                          _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1023:44)>_>,_TimeRepresentation<count_time<9,_long>_>_>
                          ::_M_run;
      local_80[3] = 0;
      std::thread::_M_start_thread(local_58,&local_80,0);
      if (local_80 != (long *)0x0) {
        (**(code **)(*local_80 + 8))();
      }
      if (p_Var3[3]._vptr__Sp_counted_base != (_func_int **)0x0) {
        std::terminate();
      }
      p_Var3[3]._vptr__Sp_counted_base = local_58[0];
      local_68.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)(p_Var3 + 1);
      local_68.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var3;
      std::__basic_future<TimeRepresentation<count_time<9,_long>_>_>::__basic_future
                (&local_78,&local_68);
      if (local_68.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_68.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      _Var2._M_pi = local_78._M_state.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      peVar1 = local_78._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      local_78._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_78._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (local_48->m_obj).timeRequestFuture.
               super___basic_future<TimeRepresentation<count_time<9,_long>_>_>._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (local_48->m_obj).timeRequestFuture.
      super___basic_future<TimeRepresentation<count_time<9,_long>_>_>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peVar1;
      (local_48->m_obj).timeRequestFuture.
      super___basic_future<TimeRepresentation<count_time<9,_long>_>_>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = _Var2._M_pi;
      if ((p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3),
         local_78._M_state.
         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_78._M_state.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      std::unique_lock<std::mutex>::~unique_lock(&local_40);
      return;
    }
    this_01 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
    pcVar4 = "cannot call request time in present state";
    sVar5 = 0x29;
  }
  message._M_str = pcVar4;
  message._M_len = sVar5;
  InvalidFunctionCall::InvalidFunctionCall(this_01,message);
  __cxa_throw(this_01,&InvalidFunctionCall::typeinfo,HelicsException::~HelicsException);
}

Assistant:

void Federate::requestTimeAsync(Time nextInternalTimeStep)
{
    if (singleThreadFederate) {
        throw(InvalidFunctionCall(
            "Async function calls and methods are not allowed for single thread federates"));
    }
    auto exp = Modes::EXECUTING;
    if (currentMode.compare_exchange_strong(exp, Modes::PENDING_TIME)) {
        preTimeRequestOperations(nextInternalTimeStep, false);
        auto asyncInfo = asyncCallInfo->lock();
        asyncInfo->timeRequestFuture =
            std::async(std::launch::async, [this, nextInternalTimeStep]() {
                return coreObject->timeRequest(fedID, nextInternalTimeStep);
            });
    } else {
        throw(InvalidFunctionCall("cannot call request time in present state"));
    }
}